

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

bool_t DataFree(nodecontext *p,node *Node,nodedata **i,bool_t DeletingNode)

{
  nodedata *pnVar1;
  nodedata *pnVar2;
  cc_memheap *pcVar3;
  size_t sVar4;
  nodedata *pnVar5;
  uint uVar6;
  
  pnVar1 = *i;
  uVar6 = (uint)pnVar1->Code & 0x3f;
  if ((ulong)uVar6 < 0x1b) {
    if (uVar6 == 0xe) {
      if (pnVar1[1].Code != 0) {
        pnVar5 = pnVar1 + 2;
        if (DeletingNode == 0) {
          pnVar5->Next = pnVar1 + 1;
        }
        else {
          pnVar5->Next = pnVar5;
        }
        return 0;
      }
      pnVar5 = pnVar1[1].Next;
      while (pnVar5 != (nodedata *)0x0) {
        pnVar2 = pnVar5->Next;
        (*p->NodeHeap->Free)(p->NodeHeap,pnVar5,0x18);
        pnVar5 = pnVar2;
      }
      goto LAB_001180b8;
    }
LAB_00118027:
    if (uVar6 != 0x17) goto LAB_001180b8;
    if (pnVar1[1].Next != (nodedata *)0x0) {
      Node_Release(pnVar1[1].Next);
      goto LAB_001180b8;
    }
  }
  else if (uVar6 == 0x1b) {
    if (p->ExprRelease != (_func_void_nodeexpr_ptr *)0x0) {
      (*p->ExprRelease)((nodeexpr *)(pnVar1 + 1));
      goto LAB_001180b8;
    }
    goto LAB_00118027;
  }
  if ((uVar6 == 0x26) && (pnVar1[2].Next != (nodedata *)0x0)) {
    (*(code *)pnVar1[2].Next)(pnVar1[2].Code,pnVar1[1].Code);
  }
LAB_001180b8:
  *i = pnVar1->Next;
  pcVar3 = p->NodeHeap;
  sVar4 = Node_DataSize(Node,pnVar1->Code >> 8,(ulong)uVar6,pnVar1 + 1,0x2a);
  (*pcVar3->Free)(pcVar3,pnVar1,sVar4 + 0x10);
  return 1;
}

Assistant:

static NOINLINE bool_t DataFree(nodecontext* p, node* Node, nodedata** i, bool_t DeletingNode)
{
    datatype Type;
    nodedata* Data = *i;
    nodenotify *n,*m;

    Type = Data->Code & TYPE_MASK;
    if (Type == TYPE_NODENOTIFY)
    {
        n=(nodenotify*)NodeData_Data(Data);
        if (n)
        {
            if (n->Func) // the notification list is being used
            {
                if (DeletingNode)
                    n->Referer = &n->Referer; // mark the node to be removed after the notification
                else
                    n->Referer = n; // mark all data to be freed after the notification
                return 0;
            }
            else
            {
                n=n->Next;
                while (n)
                {
                    m=n;
                    n=n->Next;
                    MemHeap_Free(p->NodeHeap,m,sizeof(nodenotify));
                }
            }
        }
    }
    else
    if (Type == TYPE_EXPR && p->ExprRelease)
        p->ExprRelease((nodeexpr*)NodeData_Data(Data));
    else
    if (Type == TYPE_NODE_REF && *(node**)NodeData_Data(Data))
        Node_Release(*(node**)NodeData_Data(Data));
    else
    if (Type == TYPE_NOTIFYEX)
    {
        notifyex *nx=(notifyex*)NodeData_Data(Data);
        if (nx->Free)
            nx->Free(nx->FreeCookie,nx->This);
    }

    *i = Data->Next;
    MemHeap_Free(p->NodeHeap,Data,sizeof(nodedata)+Node_DataSize(Node,(dataid)(Data->Code>>8),Type,NodeData_Data(Data),META_PARAM_UNSET)); // META_PARAM_UNSET is neutral for the type
    return 1;
}